

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

bool ON_IsValidKnotVector(int order,int cv_count,double *knot,ON_TextLog *text_logx)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *format;
  uint uVar9;
  ulong uVar10;
  ON_TextLog *this;
  double dVar11;
  
  this = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
  if (order < 2) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector order = %d (should be >= 2 )\n",(ulong)(uint)order);
    }
  }
  else if (cv_count < order) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector cv_count = %d (should be >= order=%d )\n",
                        (ulong)(uint)cv_count,(ulong)(uint)order);
    }
  }
  else if (knot == (double *)0x0) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector knot array = nullptr.\n");
    }
  }
  else {
    uVar8 = 0;
    do {
      bVar4 = ON_IsValid(knot[uVar8]);
      if (!bVar4) {
        if (this != (ON_TextLog *)0x0) {
          ON_TextLog::Print(this,"Knot vector knot[%d]=%g is not valid.\n",knot[uVar8],
                            uVar8 & 0xffffffff);
        }
        goto joined_r0x004bc277;
      }
      uVar8 = uVar8 + 1;
    } while ((cv_count + order) - 2 != uVar8);
    uVar8 = (ulong)(order - 2);
    uVar10 = (ulong)(order - 1);
    if (knot[uVar10] <= knot[uVar8]) {
      if (this == (ON_TextLog *)0x0) goto joined_r0x004bc277;
      format = 
      "Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n"
      ;
      uVar7 = (ulong)(uint)order;
    }
    else {
      uVar1 = cv_count - 2;
      uVar8 = (ulong)uVar1;
      uVar9 = cv_count - 1;
      uVar10 = (ulong)uVar9;
      if (knot[uVar10] <= knot[uVar8]) {
        if (this == (ON_TextLog *)0x0) goto joined_r0x004bc277;
        format = 
        "Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n"
        ;
        uVar7 = (ulong)(uint)cv_count;
      }
      else {
        if (cv_count + order != 3) {
          lVar6 = 0;
          dVar11 = *knot;
          do {
            lVar2 = lVar6 + 1;
            if (knot[lVar2] < dVar11) {
              if (this != (ON_TextLog *)0x0) {
                ON_TextLog::Print(this,
                                  "Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",
                                  lVar6,(ulong)((int)lVar6 + 1));
              }
              goto joined_r0x004bc277;
            }
            lVar6 = lVar6 + 1;
            dVar11 = knot[lVar2];
          } while (cv_count + order + -3 != (int)lVar6);
        }
        if (uVar9 == 0) {
          return true;
        }
        uVar5 = uVar1;
        if (*knot < knot[(ulong)(uint)order - 1]) {
          lVar6 = 0;
          do {
            if (cv_count + -2 == (int)lVar6) {
              return true;
            }
            lVar2 = (ulong)(uint)order + lVar6;
            lVar3 = lVar6 + 1;
            lVar6 = lVar6 + 1;
          } while (knot[lVar3] < knot[lVar2]);
          uVar9 = uVar9 - (int)lVar6;
          uVar5 = uVar1 - (int)lVar6;
        }
        if (this == (ON_TextLog *)0x0) goto joined_r0x004bc277;
        uVar8 = (ulong)(uVar1 - uVar5);
        format = "Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n";
        uVar7 = (ulong)(uint)order;
        uVar10 = (ulong)(cv_count - uVar9);
      }
    }
    ON_TextLog::Print(this,format,uVar7,uVar8,uVar10);
  }
joined_r0x004bc277:
  if (((ulong)text_logx & 1) != 0) {
    return false;
  }
  bVar4 = ON_IsNotValid();
  return bVar4;
}

Assistant:

bool ON_IsValidKnotVector( int order, int cv_count, const double* knot, ON_TextLog* text_logx )
{
  // If low bit of text_log pointer is 1, then ON_Error is not called when the
  // knot vector is invalid.
  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  const double *k0, *k1;
  int i;
  if ( order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order = %d (should be >= 2 )\n",order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( cv_count < order )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count = %d (should be >= order=%d )\n",cv_count,order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( knot == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector knot array = nullptr.\n");
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  for ( i = 0; i < cv_count+order-2; i++ )
  {
    if ( !ON_IsValid(knot[i]) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector knot[%d]=%g is not valid.\n",i,knot[i]);
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
  }

  if ( !(knot[order-2] < knot[order-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n",
                       order,order-2,knot[order-2],order-1,knot[order-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( !(knot[cv_count-2] < knot[cv_count-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n",
                       cv_count,cv_count-2,knot[cv_count-2],cv_count-1,knot[cv_count-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  // entire array must be monotone increasing
  k0 = knot;
  k1 = knot+1;
  i = order + cv_count - 3;
  while (i--) {
    if ( !(*k1 >= *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",
                         order+cv_count-4-i, *k0, order+cv_count-3-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  // must have knot[i+order-1] > knot[i]
  k0 = knot;
  k1 = knot + order - 1;
  i = cv_count-1;
  while(i--) {
    if ( !(*k1 > *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n",
                         order, cv_count-2-i, *k0, cv_count-1-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  return true;
}